

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_device__cork_stream__pulse(ma_device *pDevice,ma_device_type deviceType,int cork)

{
  ma_result mVar1;
  ma_pa_operation *pOP_00;
  ma_ptr local_50;
  ma_result result;
  ma_pa_operation *pOP;
  ma_pa_stream *pStream;
  ma_context *pmStack_28;
  ma_bool32 wasSuccessful;
  ma_context *pContext;
  int cork_local;
  ma_device_type deviceType_local;
  ma_device *pDevice_local;
  
  pmStack_28 = pDevice->pContext;
  if (deviceType == ma_device_type_duplex) {
    pDevice_local._4_4_ = -2;
  }
  else {
    pStream._4_4_ = 0;
    if (deviceType == ma_device_type_capture) {
      local_50 = (pDevice->field_23).pulse.pStreamCapture;
    }
    else {
      local_50 = (pDevice->field_23).pulse.pStreamPlayback;
    }
    pContext._0_4_ = cork;
    pContext._4_4_ = deviceType;
    _cork_local = pDevice;
    if (local_50 == (ma_ptr)0x0) {
      __assert_fail("pStream != __null",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                    ,0x4d74,
                    "ma_result ma_device__cork_stream__pulse(ma_device *, ma_device_type, int)");
    }
    pOP_00 = (ma_pa_operation *)
             (*(pmStack_28->field_21).alsa.snd_pcm_start)
                       (local_50,(ulong)(uint)cork,ma_pulse_operation_complete_callback,
                        (long)&pStream + 4);
    if (pOP_00 == (ma_pa_operation *)0x0) {
      mVar1 = -0x12f;
      if ((int)pContext == 0) {
        mVar1 = -0x12e;
      }
      pDevice_local._4_4_ =
           ma_post_error(_cork_local,1,"[PulseAudio] Failed to cork PulseAudio stream.",mVar1);
    }
    else {
      mVar1 = ma_device__wait_for_operation__pulse(_cork_local,pOP_00);
      (*(pmStack_28->field_21).alsa.snd_pcm_hw_params_get_channels_min)(pOP_00);
      if (mVar1 == 0) {
        if (pStream._4_4_ == 0) {
          if ((int)pContext == 0) {
            pDevice_local._4_4_ =
                 ma_post_error(_cork_local,1,"[PulseAudio] Failed to start PulseAudio stream.",
                               -0x12e);
          }
          else {
            pDevice_local._4_4_ =
                 ma_post_error(_cork_local,1,"[PulseAudio] Failed to stop PulseAudio stream.",-0x12f
                              );
          }
        }
        else {
          pDevice_local._4_4_ = 0;
        }
      }
      else {
        pDevice_local._4_4_ =
             ma_post_error(_cork_local,1,
                           "[PulseAudio] An error occurred while waiting for the PulseAudio stream to cork."
                           ,mVar1);
      }
    }
  }
  return pDevice_local._4_4_;
}

Assistant:

static ma_result ma_device__cork_stream__pulse(ma_device* pDevice, ma_device_type deviceType, int cork)
{
    ma_context* pContext = pDevice->pContext;
    ma_bool32 wasSuccessful;
    ma_pa_stream* pStream;
    ma_pa_operation* pOP;
    ma_result result;

    /* This should not be called with a duplex device type. */
    if (deviceType == ma_device_type_duplex) {
        return MA_INVALID_ARGS;
    }

    wasSuccessful = MA_FALSE;

    pStream = (ma_pa_stream*)((deviceType == ma_device_type_capture) ? pDevice->pulse.pStreamCapture : pDevice->pulse.pStreamPlayback);
    MA_ASSERT(pStream != NULL);

    pOP = ((ma_pa_stream_cork_proc)pContext->pulse.pa_stream_cork)(pStream, cork, ma_pulse_operation_complete_callback, &wasSuccessful);
    if (pOP == NULL) {
        return ma_post_error(pDevice, MA_LOG_LEVEL_ERROR, "[PulseAudio] Failed to cork PulseAudio stream.", (cork == 0) ? MA_FAILED_TO_START_BACKEND_DEVICE : MA_FAILED_TO_STOP_BACKEND_DEVICE);
    }

    result = ma_device__wait_for_operation__pulse(pDevice, pOP);
    ((ma_pa_operation_unref_proc)pContext->pulse.pa_operation_unref)(pOP);

    if (result != MA_SUCCESS) {
        return ma_post_error(pDevice, MA_LOG_LEVEL_ERROR, "[PulseAudio] An error occurred while waiting for the PulseAudio stream to cork.", result);
    }

    if (!wasSuccessful) {
        if (cork) {
            return ma_post_error(pDevice, MA_LOG_LEVEL_ERROR, "[PulseAudio] Failed to stop PulseAudio stream.", MA_FAILED_TO_STOP_BACKEND_DEVICE);
        } else {
            return ma_post_error(pDevice, MA_LOG_LEVEL_ERROR, "[PulseAudio] Failed to start PulseAudio stream.", MA_FAILED_TO_START_BACKEND_DEVICE);
        }
    }

    return MA_SUCCESS;
}